

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O0

string * choc::text::createHexString<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long v,int minNumDigits)

{
  char *__end;
  char *__beg;
  allocator<char> local_69;
  char *local_68;
  char *d;
  char *end;
  char hex [40];
  ulong local_28;
  type value;
  int minNumDigits_local;
  unsigned_long v_local;
  
  soul::checkAssertion(minNumDigits < 0x21,"minNumDigits <= 32","createHexString",0x9e);
  __end = hex + 0x1f;
  hex[0x1f] = '\0';
  local_68 = __end;
  local_28 = v;
  value._4_4_ = minNumDigits;
  do {
    do {
      __beg = local_68 + -1;
      local_68[-1] = "0123456789abcdef"[(uint)local_28 & 0xf];
      local_28 = local_28 >> 4;
      value._4_4_ = value._4_4_ + -1;
      local_68 = __beg;
    } while (local_28 != 0);
  } while (0 < value._4_4_);
  d = __end;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>((string *)__return_storage_ptr__,__beg,__end,&local_69);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

std::string createHexString (IntegerType v, int minNumDigits)
{
    static_assert (std::is_integral<IntegerType>::value, "Need to pass integers into this method");
    auto value = static_cast<typename std::make_unsigned<IntegerType>::type> (v);
    CHOC_ASSERT (minNumDigits <= 32);

    char hex[40];
    const auto end = hex + sizeof (hex) - 1;
    auto d = end;
    *d = 0;

    for (;;)
    {
        *--d = "0123456789abcdef"[static_cast<uint32_t> (value) & 15u];
        value = static_cast<decltype (value)> (value >> 4);
        --minNumDigits;

        if (value == 0 && minNumDigits <= 0)
            return std::string (d, end);
    }
}